

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnImportMemory
          (BinaryReaderIR *this,Index import_index,string_view module_name,string_view field_name,
          Index memory_index,Limits *page_limits)

{
  Module *this_00;
  uint64_t uVar1;
  pointer *__ptr;
  __uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_> local_78;
  undefined1 local_70 [32];
  char *local_50;
  Location local_48;
  
  local_50 = module_name._M_str;
  local_70._24_8_ = module_name._M_len;
  local_70._16_8_ = field_name._M_str;
  local_70._8_8_ = field_name._M_len;
  std::make_unique<wabt::MemoryImport>();
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)(local_70._0_8_ + 8),
             (basic_string_view<char,_std::char_traits<char>_> *)(local_70 + 0x18));
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)(local_70._0_8_ + 0x28),
             (basic_string_view<char,_std::char_traits<char>_> *)(local_70 + 8));
  uVar1 = page_limits->max;
  *(uint64_t *)(local_70._0_8_ + 0x70) = page_limits->initial;
  *(uint64_t *)(local_70._0_8_ + 0x78) = uVar1;
  *(undefined4 *)(local_70._0_8_ + 0x7f) = *(undefined4 *)((long)&page_limits->max + 7);
  this_00 = this->module_;
  GetLocation(&local_48,this);
  std::
  make_unique<wabt::ImportModuleField,std::unique_ptr<wabt::MemoryImport,std::default_delete<wabt::MemoryImport>>,wabt::Location>
            ((unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_> *)&local_78,
             (Location *)local_70);
  Module::AppendField(this_00,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                               *)&local_78);
  if (local_78._M_t.
      super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
      super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>)0x0) {
    (**(code **)(*(long *)local_78._M_t.
                          super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>
                          .super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl + 8))();
  }
  local_78._M_t.
  super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
  super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl =
       (tuple<wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>)
       (_Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>)0x0;
  if ((long *)local_70._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_70._0_8_ + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnImportMemory(Index import_index,
                                      std::string_view module_name,
                                      std::string_view field_name,
                                      Index memory_index,
                                      const Limits* page_limits) {
  auto import = std::make_unique<MemoryImport>();
  import->module_name = module_name;
  import->field_name = field_name;
  import->memory.page_limits = *page_limits;
  module_->AppendField(
      std::make_unique<ImportModuleField>(std::move(import), GetLocation()));
  return Result::Ok;
}